

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance_array.cpp
# Opt level: O1

BBox3fa * embree::anon_unknown_117::boundSegmentNonlinear
                    (BBox3fa *__return_storage_ptr__,MotionDerivativeCoefficients *motionDerivCoeffs
                    ,AffineSpace3fa *xfm0,AffineSpace3fa *xfm1,BBox3fa *obbox0,BBox3fa *obbox1,
                    BBox3fa *bbox0,BBox3fa *bbox1,float tmin,float tmax)

{
  int iVar1;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar2;
  uint uVar3;
  int dim;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  float fVar19;
  float fVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  uint numRoots;
  BBox3fa bt;
  Interval1f interval;
  Vec3fa p1;
  Vec3fa p0;
  MotionDerivative motionDerivative;
  float roots [32];
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float local_2b8 [4];
  undefined1 local_2a8 [12];
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  ulong local_270;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [12];
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8 [4];
  BBox3fa *local_1b8;
  Interval1f local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  ulong local_120;
  ulong local_118;
  BBox3fa *local_110;
  BBox3fa *local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  MotionDerivativeCoefficients *local_e8;
  MotionDerivative local_dc;
  float local_b8 [34];
  
  (__return_storage_ptr__->upper).field_0.m128[0] = 0.0;
  (__return_storage_ptr__->upper).field_0.m128[1] = 0.0;
  (__return_storage_ptr__->upper).field_0.m128[2] = 0.0;
  (__return_storage_ptr__->upper).field_0.m128[3] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[0] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[1] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[2] = 0.0;
  (__return_storage_ptr__->lower).field_0.m128[3] = 0.0;
  local_120 = 0;
  local_1b8 = __return_storage_ptr__;
  local_1b0.lower = tmin;
  local_1b0.upper = tmax;
  local_110 = obbox0;
  local_108 = obbox1;
  local_e8 = motionDerivCoeffs;
  do {
    local_100 = (ulong)((int)local_120 != 0) << 4;
    local_118 = 0;
    do {
      local_f8 = (ulong)((int)local_118 != 0) << 4 | 4;
      local_f0 = 0;
      do {
        bVar6 = (int)local_f0 != 0;
        local_138.m128[1] = (float)*(undefined4 *)((long)&(local_110->lower).field_0 + local_f8);
        local_138.m128[0] = (float)*(undefined4 *)((long)&(local_110->lower).field_0 + local_100);
        local_138.m128[2] = (&local_110->lower)[bVar6].field_0.m128[2];
        local_138.m128[3] = 0.0;
        local_148.m128[1] = (float)*(undefined4 *)((long)&(local_108->lower).field_0 + local_f8);
        local_148.m128[0] = (float)*(undefined4 *)((long)&(local_108->lower).field_0 + local_100);
        local_148.m128[2] = (&local_108->lower)[bVar6].field_0.m128[2];
        local_148.m128[3] = 0.0;
        lVar4 = 0;
        do {
          MotionDerivative::MotionDerivative
                    (&local_dc,local_e8,(int)lVar4,(Vec3fa *)&local_138.field_1,
                     (Vec3fa *)&local_148.field_1);
          fStack_1d0 = (bbox0->lower).field_0.m128[lVar4] - (bbox1->lower).field_0.m128[lVar4];
          local_2b8[0] = 0.0;
          local_1d8 = (undefined1  [8])&local_dc;
          MotionDerivative::
          findRoots<embree::MotionDerivative::EvalMotionDerivative<embree::Interval<float>>>
                    ((EvalMotionDerivative<embree::Interval<float>_> *)local_1d8,&local_1b0,
                     (uint *)local_2b8,local_b8,0x20);
          local_270 = (ulong)(uint)local_2b8[0];
          if (local_270 != 0) {
            fVar11 = (__return_storage_ptr__->lower).field_0.m128[lVar4];
            uVar5 = 0;
            do {
              local_288 = local_b8[uVar5];
              _local_218 = ZEXT416((uint)local_288);
              local_258 = 1.0 - local_288;
              local_268 = ZEXT416((uint)local_258);
              fStack_1d0 = (bbox0->lower).field_0.m128[2] * local_258 +
                           (bbox1->lower).field_0.m128[2] * local_288;
              fStack_1cc = (bbox0->lower).field_0.m128[3] * local_258 +
                           (bbox1->lower).field_0.m128[3] * local_288;
              local_1c8[0] = (bbox0->upper).field_0.m128[0] * local_258 +
                             (bbox1->upper).field_0.m128[0] * local_288;
              local_1c8[1] = (bbox0->upper).field_0.m128[1] * local_258 +
                             (bbox1->upper).field_0.m128[1] * local_288;
              local_1c8[2] = (bbox0->upper).field_0.m128[2] * local_258 +
                             (bbox1->upper).field_0.m128[2] * local_288;
              local_1c8[3] = (bbox0->upper).field_0.m128[3] * local_258 +
                             (bbox1->upper).field_0.m128[3] * local_288;
              local_1d8._4_4_ =
                   (bbox0->lower).field_0.m128[1] * local_258 +
                   (bbox1->lower).field_0.m128[1] * local_288;
              local_1d8._0_4_ =
                   (bbox0->lower).field_0.m128[0] * local_258 +
                   (bbox1->lower).field_0.m128[0] * local_288;
              local_298 = (xfm0->l).vx.field_0.m128[0];
              fStack_294 = (xfm0->l).vx.field_0.m128[1];
              fStack_290 = (xfm0->l).vx.field_0.m128[2];
              fVar9 = (xfm0->l).vx.field_0.m128[3];
              local_1e8 = (xfm0->l).vy.field_0.m128[0];
              fStack_1e4 = (xfm0->l).vy.field_0.m128[1];
              fStack_1e0 = (xfm0->l).vy.field_0.m128[2];
              fStack_1dc = (xfm0->l).vy.field_0.m128[3];
              local_158 = (xfm0->l).vz.field_0.m128[0];
              fStack_154 = (xfm0->l).vz.field_0.m128[1];
              fStack_150 = (xfm0->l).vz.field_0.m128[2];
              fStack_244 = *(float *)((long)&(xfm0->l).vz.field_0 + 0xc);
              aVar2 = (xfm0->p).field_0.field_1;
              local_168 = (xfm1->l).vx.field_0.m128[0];
              fStack_164 = (xfm1->l).vx.field_0.m128[1];
              fStack_160 = (xfm1->l).vx.field_0.m128[2];
              fStack_15c = (xfm1->l).vx.field_0.m128[3];
              local_208 = (xfm1->l).vy.field_0.m128[0];
              fStack_204 = (xfm1->l).vy.field_0.m128[1];
              fStack_200 = (xfm1->l).vy.field_0.m128[2];
              fStack_1fc = (xfm1->l).vy.field_0.m128[3];
              local_1f8 = (xfm1->p).field_0.m128[0];
              fStack_1f4 = (xfm1->p).field_0.m128[1];
              fStack_1f0 = (xfm1->p).field_0.m128[2];
              fStack_1ec = (xfm1->p).field_0.m128[3];
              local_178 = (xfm1->l).vz.field_0.m128[0];
              fStack_174 = (xfm1->l).vz.field_0.m128[1];
              fStack_170 = (xfm1->l).vz.field_0.m128[2];
              local_188 = (xfm1->l).vz.field_0.m128[3];
              local_228._4_4_ = fStack_244;
              local_228._0_4_ = fStack_244;
              fStack_220 = fStack_244;
              fStack_21c = fStack_244;
              local_248 = fStack_244 * local_188 +
                          fStack_1fc * fStack_1dc +
                          fStack_1ec * (xfm0->p).field_0.m128[3] + fVar9 * fStack_15c;
              local_198 = -local_248;
              fStack_234 = -fStack_244;
              fStack_230 = -fStack_244;
              fStack_22c = -fStack_244;
              local_238 = local_248;
              local_1a8 = fStack_15c;
              if (local_248 < local_198) {
                local_1a8 = -fStack_15c;
                local_238 = local_198;
              }
              local_2a8._0_4_ = ABS(local_248);
              fVar12 = (((((float)local_2a8._0_4_ * -0.0043095737 + 0.0192803) *
                          (float)local_2a8._0_4_ + -0.04489909) * (float)local_2a8._0_4_ +
                        0.08785567) * (float)local_2a8._0_4_ + -0.21450998) * (float)local_2a8._0_4_
              ;
              fVar7 = 1.0 - (float)local_2a8._0_4_;
              fStack_28c = fVar9;
              fStack_284 = local_288;
              fStack_280 = local_288;
              fStack_27c = local_288;
              fStack_254 = local_258;
              fStack_250 = local_258;
              fStack_24c = local_258;
              fStack_240 = fStack_244;
              fStack_23c = fStack_244;
              fStack_1a4 = local_1a8;
              fStack_1a0 = local_1a8;
              fStack_19c = local_1a8;
              fStack_194 = fStack_234;
              fStack_190 = fStack_230;
              fStack_18c = fStack_22c;
              fStack_184 = local_188;
              fStack_180 = local_188;
              fStack_17c = local_188;
              fStack_16c = local_188;
              fStack_14c = fStack_244;
              if (fVar7 < 0.0) {
                local_2a8._0_8_ = CONCAT44(fStack_244,local_2a8._0_4_) & 0x7fffffffffffffff;
                local_2a8._8_4_ = ABS(fStack_244);
                fStack_29c = ABS(fStack_244);
                fVar7 = sqrtf(fVar7);
              }
              else {
                fVar7 = SQRT(fVar7);
              }
              bVar6 = local_248 < 0.0;
              fVar12 = 1.5707964 - fVar7 * (fVar12 + 1.5707952);
              fVar7 = 0.0;
              if (0.0 <= fVar12) {
                fVar7 = fVar12;
              }
              fVar7 = (float)(-(uint)(1.0 < (float)local_2a8._0_4_) & 0x7fc00000 |
                             ~-(uint)(1.0 < (float)local_2a8._0_4_) &
                             (uint)(1.5707964 -
                                   (float)((uint)-fVar7 & -(uint)(local_238 < 0.0) |
                                          ~-(uint)(local_238 < 0.0) & (uint)fVar7))) *
                      (float)local_218._0_4_;
              _local_2a8 = ZEXT416((uint)fVar7);
              fVar8 = floorf(fVar7 * 0.63661975);
              fVar10 = (float)local_2a8._0_4_ - fVar8 * 1.5707964;
              fVar7 = fVar10 * fVar10;
              fVar12 = ((((fVar7 * -2.5963018e-07 + 2.4756235e-05) * fVar7 + -0.001388833) * fVar7 +
                        0.04166664) * fVar7 + -0.5) * fVar7 + 1.0;
              fVar10 = (((((fVar7 * -2.5029328e-08 + 2.7600126e-06) * fVar7 + -0.00019842605) *
                          fVar7 + 0.008333348) * fVar7 + -0.16666667) * fVar7 + 1.0) * fVar10;
              fVar7 = fVar10;
              if (((int)fVar8 & 1U) != 0) {
                fVar7 = fVar12;
                fVar12 = fVar10;
              }
              uVar3 = (int)fVar8 & 3;
              if (1 < uVar3) {
                fVar7 = -fVar7;
              }
              fVar8 = (float)(~-(uint)(local_248 < local_198) & (uint)local_188 |
                             (uint)-local_188 & -(uint)(local_248 < local_198));
              if (uVar3 - 1 < 2) {
                fVar12 = -fVar12;
              }
              fVar14 = local_238 * fVar9 - local_1a8;
              fVar13 = local_238 * (float)local_228._0_4_ - fVar8;
              fVar10 = (float)local_268._0_4_ * fVar9 + local_1a8 * (float)local_218._0_4_;
              fVar8 = (float)local_268._0_4_ * (float)local_228._0_4_ +
                      (float)local_218._0_4_ * fVar8;
              uVar3 = (int)((uint)bVar6 << 0x1f) >> 0x1f;
              uVar18 = (int)((uint)bVar6 << 0x1f) >> 0x1f;
              fVar19 = (float)((uint)-fStack_1ec & uVar3 | ~uVar3 & (uint)fStack_1ec);
              fVar24 = (float)((uint)-fStack_1fc & uVar18 | ~uVar18 & (uint)fStack_1fc);
              fStack_2c4 = aVar2.y;
              fVar34 = local_238 * fStack_2c4 - fVar19;
              fVar36 = local_238 * fStack_1dc - fVar24;
              auVar20._4_4_ = fStack_234;
              auVar20._0_4_ = fVar13;
              auVar20._8_4_ = fStack_230;
              auVar20._12_4_ = fStack_22c;
              auVar21._4_12_ = auVar20._4_12_;
              auVar21._0_4_ = fVar13 * fVar13 + fVar36 * fVar36 + fVar34 * fVar34 + fVar14 * fVar14;
              auVar16._4_4_ = fStack_234;
              auVar16._0_4_ = auVar21._0_4_;
              auVar16._8_4_ = fStack_230;
              auVar16._12_4_ = fStack_22c;
              auVar16 = rsqrtss(auVar16,auVar21);
              fVar15 = auVar16._0_4_;
              fVar15 = fVar15 * fVar15 * auVar21._0_4_ * -0.5 * fVar15 + fVar15 * 1.5;
              fVar19 = local_258 * fStack_2c4 + fVar19 * local_288;
              fVar24 = fStack_254 * fStack_1dc + fVar24 * fStack_284;
              auVar28._4_4_ = local_268._4_4_;
              auVar28._0_4_ = fVar8;
              auVar28._8_4_ = local_268._8_4_;
              auVar28._12_4_ = local_268._12_4_;
              auVar29._4_12_ = auVar28._4_12_;
              auVar29._0_4_ = fVar8 * fVar8 + fVar24 * fVar24 + fVar19 * fVar19 + fVar10 * fVar10;
              auVar26._4_4_ = local_268._4_4_;
              auVar26._0_4_ = auVar29._0_4_;
              auVar26._8_4_ = local_268._8_4_;
              auVar26._12_4_ = local_268._12_4_;
              auVar16 = rsqrtss(auVar26,auVar29);
              fVar25 = auVar16._0_4_;
              fVar25 = fVar25 * fVar25 * auVar29._0_4_ * -0.5 * fVar25 + fVar25 * 1.5;
              if (0.9995 < local_238) {
                fVar10 = fVar10 * fVar25;
              }
              else {
                fVar10 = fVar9 * fVar12 - fVar14 * fVar15 * fVar7;
              }
              uVar3 = (int)((uint)(0.9995 < local_238) << 0x1f) >> 0x1f;
              uVar18 = (int)((uint)(0.9995 < local_238) << 0x1f) >> 0x1f;
              fVar9 = (float)(~uVar3 & (uint)(fVar12 * fStack_2c4 - fVar7 * fVar34 * fVar15) |
                             (uint)(fVar19 * fVar25) & uVar3);
              fVar14 = (float)(~uVar18 & (uint)(fVar12 * fStack_1dc - fVar7 * fVar36 * fVar15) |
                              (uint)(fVar24 * fVar25) & uVar18);
              if (0.9995 < local_238) {
                fVar8 = fVar8 * fVar25;
              }
              else {
                fVar8 = fVar12 * (float)local_228._0_4_ - fVar13 * fVar15 * fVar7;
              }
              local_298 = local_298 * local_258 + local_168 * local_288;
              fStack_294 = fStack_294 * fStack_254 + fStack_164 * fStack_284;
              fStack_290 = fStack_290 * fStack_250 + fStack_160 * fStack_280;
              fStack_28c = fStack_28c * fStack_24c + fStack_15c * fStack_27c;
              fVar42 = local_1e8 * local_258 + local_208 * local_288;
              fVar43 = fStack_1e4 * fStack_254 + fStack_204 * fStack_284;
              fVar39 = local_158 * local_258 + local_178 * local_288;
              fVar40 = fStack_154 * fStack_254 + fStack_174 * fStack_284;
              fVar41 = fStack_150 * fStack_250 + fStack_170 * fStack_280;
              local_2c8 = aVar2.x;
              fStack_2c0 = aVar2.z;
              fVar35 = local_2c8 * local_258 + local_1f8 * local_288;
              fVar37 = fStack_2c4 * fStack_254 + fStack_1f4 * fStack_284;
              fVar38 = fStack_2c0 * fStack_250 + fStack_1f0 * fStack_280;
              fVar24 = fVar10 * fVar14 + fVar9 * fVar8;
              fVar12 = fVar10 * fVar14 - fVar9 * fVar8;
              fVar15 = fVar9 * fVar9 - fVar10 * fVar10;
              fVar13 = fVar9 * fVar9 + fVar10 * fVar10 + -fVar14 * fVar14 + -fVar8 * fVar8;
              fVar36 = fVar14 * fVar14 + fVar15 + -fVar8 * fVar8;
              fVar32 = fVar10 * fVar8 - fVar9 * fVar14;
              fVar34 = fVar9 * fVar14 + fVar10 * fVar8;
              fVar7 = fVar14 * fVar8 + fVar9 * fVar10;
              fVar25 = fVar14 * fVar8 - fVar9 * fVar10;
              fVar9 = fVar8 * fVar8 + fVar15 + -fVar14 * fVar14;
              fVar24 = fVar24 + fVar24;
              fVar32 = fVar32 + fVar32;
              fVar12 = fVar12 + fVar12;
              fVar7 = fVar7 + fVar7;
              fVar34 = fVar34 + fVar34;
              fVar25 = fVar25 + fVar25;
              fVar14 = fVar13 * 1.0 + fVar24 * 0.0 + fVar32 * 0.0;
              fVar15 = fVar13 * 0.0 + fVar24 * 1.0 + fVar32 * 0.0;
              fVar19 = fVar13 * 0.0 + fVar24 * 0.0 + fVar32 * 1.0;
              fVar24 = fVar13 * 0.0 + fVar24 * 0.0 + fVar32 * 0.0;
              fVar8 = fVar12 * 1.0 + fVar36 * 0.0 + fVar7 * 0.0;
              fVar10 = fVar12 * 0.0 + fVar36 * 1.0 + fVar7 * 0.0;
              fVar13 = fVar12 * 0.0 + fVar36 * 0.0 + fVar7 * 1.0;
              fVar7 = fVar12 * 0.0 + fVar36 * 0.0 + fVar7 * 0.0;
              fVar12 = fVar34 * 1.0 + fVar25 * 0.0 + fVar9 * 0.0;
              fVar36 = fVar34 * 0.0 + fVar25 * 1.0 + fVar9 * 0.0;
              fVar32 = fVar34 * 0.0 + fVar25 * 0.0 + fVar9 * 1.0;
              fVar9 = fVar34 * 0.0 + fVar25 * 0.0 + fVar9 * 0.0;
              fVar25 = local_258 * local_138.m128[0] + local_288 * local_148.m128[0];
              fVar34 = fStack_254 * local_138.m128[1] + fStack_284 * local_148.m128[1];
              fVar33 = fStack_250 * local_138.m128[2] + fStack_280 * local_148.m128[2];
              local_2b8[3] = fVar33 * (fVar39 * fVar24 + fVar40 * fVar7 + fVar41 * fVar9) +
                             fVar35 * fVar24 + fVar37 * fVar7 + fVar38 * fVar9 + 0.0 +
                             fVar34 * (fVar42 * fVar24 + fVar43 * fVar7 + fVar9 * 0.0) +
                             fVar25 * (local_298 * fVar24 + fVar7 * 0.0 + fVar9 * 0.0);
              local_2b8[0] = fVar33 * (fVar39 * fVar14 + fVar40 * fVar8 + fVar41 * fVar12) +
                             fVar35 * fVar14 + fVar37 * fVar8 + fVar38 * fVar12 + fStack_294 + 0.0 +
                             fVar34 * (fVar42 * fVar14 + fVar43 * fVar8 + fVar12 * 0.0) +
                             fVar25 * (local_298 * fVar14 + fVar8 * 0.0 + fVar12 * 0.0);
              local_2b8[1] = fVar33 * (fVar39 * fVar15 + fVar40 * fVar10 + fVar41 * fVar36) +
                             fVar35 * fVar15 + fVar37 * fVar10 + fVar38 * fVar36 + fStack_290 + 0.0
                             + fVar34 * (fVar42 * fVar15 + fVar43 * fVar10 + fVar36 * 0.0) +
                             fVar25 * (local_298 * fVar15 + fVar10 * 0.0 + fVar36 * 0.0);
              local_2b8[2] = fVar33 * (fVar39 * fVar19 + fVar40 * fVar13 + fVar41 * fVar32) +
                             fVar35 * fVar19 + fVar37 * fVar13 + fVar38 * fVar32 +
                             fStack_1e0 * fStack_250 + fStack_200 * fStack_280 + 0.0 +
                             fVar34 * (fVar42 * fVar19 + fVar43 * fVar13 + fVar32 * 0.0) +
                             fVar25 * (local_298 * fVar19 + fVar13 * 0.0 + fVar32 * 0.0);
              fVar9 = local_2b8[lVar4] - *(float *)(local_1d8 + lVar4 * 4);
              if (fVar11 <= local_2b8[lVar4] - *(float *)(local_1d8 + lVar4 * 4)) {
                fVar9 = fVar11;
              }
              fVar11 = fVar9;
              uVar5 = uVar5 + 1;
            } while (local_270 != uVar5);
            (local_1b8->lower).field_0.m128[lVar4] = fVar11;
            __return_storage_ptr__ = local_1b8;
          }
          fStack_1d0 = (bbox0->upper).field_0.m128[lVar4] - (bbox1->upper).field_0.m128[lVar4];
          local_2b8[0] = 0.0;
          local_1d8 = (undefined1  [8])&local_dc;
          MotionDerivative::
          findRoots<embree::MotionDerivative::EvalMotionDerivative<embree::Interval<float>>>
                    ((EvalMotionDerivative<embree::Interval<float>_> *)local_1d8,&local_1b0,
                     (uint *)local_2b8,local_b8,0x20);
          local_270 = (ulong)(uint)local_2b8[0];
          if (local_270 != 0) {
            fVar11 = (__return_storage_ptr__->upper).field_0.m128[lVar4];
            uVar5 = 0;
            do {
              local_288 = local_b8[uVar5];
              _local_228 = ZEXT416((uint)local_288);
              local_258 = 1.0 - local_288;
              local_268 = ZEXT416((uint)local_258);
              fStack_1d0 = (bbox0->lower).field_0.m128[2] * local_258 +
                           (bbox1->lower).field_0.m128[2] * local_288;
              fStack_1cc = (bbox0->lower).field_0.m128[3] * local_258 +
                           (bbox1->lower).field_0.m128[3] * local_288;
              local_1c8[0] = (bbox0->upper).field_0.m128[0] * local_258 +
                             (bbox1->upper).field_0.m128[0] * local_288;
              local_1c8[1] = (bbox0->upper).field_0.m128[1] * local_258 +
                             (bbox1->upper).field_0.m128[1] * local_288;
              local_1c8[2] = (bbox0->upper).field_0.m128[2] * local_258 +
                             (bbox1->upper).field_0.m128[2] * local_288;
              local_1c8[3] = (bbox0->upper).field_0.m128[3] * local_258 +
                             (bbox1->upper).field_0.m128[3] * local_288;
              local_1d8._4_4_ =
                   (bbox0->lower).field_0.m128[1] * local_258 +
                   (bbox1->lower).field_0.m128[1] * local_288;
              local_1d8._0_4_ =
                   (bbox0->lower).field_0.m128[0] * local_258 +
                   (bbox1->lower).field_0.m128[0] * local_288;
              local_298 = (xfm0->l).vx.field_0.m128[0];
              fStack_294 = (xfm0->l).vx.field_0.m128[1];
              fStack_290 = (xfm0->l).vx.field_0.m128[2];
              fVar9 = (xfm0->l).vx.field_0.m128[3];
              local_1e8 = (xfm0->l).vy.field_0.m128[0];
              fStack_1e4 = (xfm0->l).vy.field_0.m128[1];
              fStack_1e0 = (xfm0->l).vy.field_0.m128[2];
              fStack_1dc = (xfm0->l).vy.field_0.m128[3];
              local_158 = (xfm0->l).vz.field_0.m128[0];
              fStack_154 = (xfm0->l).vz.field_0.m128[1];
              fStack_150 = (xfm0->l).vz.field_0.m128[2];
              fStack_244 = (xfm0->l).vz.field_0.m128[3];
              aVar2 = (xfm0->p).field_0.field_1;
              local_168 = (xfm1->l).vx.field_0.m128[0];
              fStack_164 = (xfm1->l).vx.field_0.m128[1];
              fStack_160 = (xfm1->l).vx.field_0.m128[2];
              fStack_15c = (xfm1->l).vx.field_0.m128[3];
              local_208 = (xfm1->l).vy.field_0.m128[0];
              fStack_204 = (xfm1->l).vy.field_0.m128[1];
              fStack_200 = (xfm1->l).vy.field_0.m128[2];
              fStack_1fc = (xfm1->l).vy.field_0.m128[3];
              local_1f8 = (xfm1->p).field_0.m128[0];
              fStack_1f4 = (xfm1->p).field_0.m128[1];
              fStack_1f0 = (xfm1->p).field_0.m128[2];
              fStack_1ec = (xfm1->p).field_0.m128[3];
              local_178 = (xfm1->l).vz.field_0.m128[0];
              fStack_174 = (xfm1->l).vz.field_0.m128[1];
              fStack_170 = (xfm1->l).vz.field_0.m128[2];
              local_188 = (xfm1->l).vz.field_0.m128[3];
              local_248 = fStack_244 * local_188 +
                          fStack_1fc * fStack_1dc +
                          fStack_1ec * (xfm0->p).field_0.m128[3] + fVar9 * fStack_15c;
              local_198 = -local_248;
              fStack_194 = -fStack_244;
              fStack_190 = -fStack_244;
              fStack_18c = -fStack_244;
              fVar7 = local_248;
              local_1a8 = fStack_15c;
              if (local_248 < local_198) {
                local_1a8 = -fStack_15c;
                fVar7 = local_198;
              }
              local_218._0_8_ = CONCAT44(fStack_244,fVar7) ^ 0x8000000000000000;
              local_218._8_4_ = fStack_190;
              fStack_20c = fStack_18c;
              local_2a8._0_4_ = ABS(local_248);
              fVar12 = (((((float)local_2a8._0_4_ * -0.0043095737 + 0.0192803) *
                          (float)local_2a8._0_4_ + -0.04489909) * (float)local_2a8._0_4_ +
                        0.08785567) * (float)local_2a8._0_4_ + -0.21450998) * (float)local_2a8._0_4_
              ;
              fVar7 = 1.0 - (float)local_2a8._0_4_;
              local_238 = fStack_244;
              fStack_28c = fVar9;
              fStack_284 = local_288;
              fStack_280 = local_288;
              fStack_27c = local_288;
              fStack_254 = local_258;
              fStack_250 = local_258;
              fStack_24c = local_258;
              fStack_240 = fStack_244;
              fStack_23c = fStack_244;
              fStack_234 = fStack_244;
              fStack_230 = fStack_244;
              fStack_22c = fStack_244;
              fStack_1a4 = local_1a8;
              fStack_1a0 = local_1a8;
              fStack_19c = local_1a8;
              fStack_184 = local_188;
              fStack_180 = local_188;
              fStack_17c = local_188;
              fStack_16c = local_188;
              fStack_14c = fStack_244;
              if (fVar7 < 0.0) {
                local_2a8._0_8_ = CONCAT44(fStack_244,local_2a8._0_4_) & 0x7fffffffffffffff;
                local_2a8._8_4_ = ABS(fStack_244);
                fStack_29c = ABS(fStack_244);
                fVar7 = sqrtf(fVar7);
              }
              else {
                fVar7 = SQRT(fVar7);
              }
              bVar6 = local_248 < 0.0;
              fVar12 = 1.5707964 - fVar7 * (fVar12 + 1.5707952);
              fVar7 = 0.0;
              if (0.0 <= fVar12) {
                fVar7 = fVar12;
              }
              fVar7 = (float)(-(uint)(1.0 < (float)local_2a8._0_4_) & 0x7fc00000 |
                             ~-(uint)(1.0 < (float)local_2a8._0_4_) &
                             (uint)(1.5707964 -
                                   (float)((uint)-fVar7 & -(uint)((float)local_218._0_4_ < 0.0) |
                                          ~-(uint)((float)local_218._0_4_ < 0.0) & (uint)fVar7))) *
                      (float)local_228._0_4_;
              _local_2a8 = ZEXT416((uint)fVar7);
              fVar8 = floorf(fVar7 * 0.63661975);
              fVar10 = (float)local_2a8._0_4_ - fVar8 * 1.5707964;
              fVar7 = fVar10 * fVar10;
              fVar12 = ((((fVar7 * -2.5963018e-07 + 2.4756235e-05) * fVar7 + -0.001388833) * fVar7 +
                        0.04166664) * fVar7 + -0.5) * fVar7 + 1.0;
              fVar10 = (((((fVar7 * -2.5029328e-08 + 2.7600126e-06) * fVar7 + -0.00019842605) *
                          fVar7 + 0.008333348) * fVar7 + -0.16666667) * fVar7 + 1.0) * fVar10;
              fVar7 = fVar10;
              if (((int)fVar8 & 1U) != 0) {
                fVar7 = fVar12;
                fVar12 = fVar10;
              }
              uVar3 = (int)fVar8 & 3;
              if (1 < uVar3) {
                fVar7 = -fVar7;
              }
              fVar8 = (float)(~-(uint)(local_248 < local_198) & (uint)local_188 |
                             (uint)-local_188 & -(uint)(local_248 < local_198));
              if (uVar3 - 1 < 2) {
                fVar12 = -fVar12;
              }
              fVar14 = (float)local_218._0_4_ * fVar9 - local_1a8;
              fVar13 = (float)local_218._0_4_ * local_238 - fVar8;
              fVar10 = (float)local_268._0_4_ * fVar9 + local_1a8 * (float)local_228._0_4_;
              fVar8 = (float)local_268._0_4_ * local_238 + (float)local_228._0_4_ * fVar8;
              uVar3 = (int)((uint)bVar6 << 0x1f) >> 0x1f;
              uVar18 = (int)((uint)bVar6 << 0x1f) >> 0x1f;
              fVar19 = (float)((uint)-fStack_1ec & uVar3 | ~uVar3 & (uint)fStack_1ec);
              fVar24 = (float)((uint)-fStack_1fc & uVar18 | ~uVar18 & (uint)fStack_1fc);
              fStack_2c4 = aVar2.y;
              fVar34 = (float)local_218._0_4_ * fStack_2c4 - fVar19;
              fVar36 = (float)local_218._0_4_ * fStack_1dc - fVar24;
              auVar22._4_4_ = local_218._4_4_;
              auVar22._0_4_ = fVar13;
              auVar22._8_4_ = local_218._8_4_;
              auVar22._12_4_ = fStack_20c;
              auVar23._4_12_ = auVar22._4_12_;
              auVar23._0_4_ = fVar13 * fVar13 + fVar36 * fVar36 + fVar34 * fVar34 + fVar14 * fVar14;
              auVar17._4_4_ = local_218._4_4_;
              auVar17._0_4_ = auVar23._0_4_;
              auVar17._8_4_ = local_218._8_4_;
              auVar17._12_4_ = fStack_20c;
              auVar16 = rsqrtss(auVar17,auVar23);
              fVar15 = auVar16._0_4_;
              fVar15 = fVar15 * fVar15 * auVar23._0_4_ * -0.5 * fVar15 + fVar15 * 1.5;
              fVar19 = local_258 * fStack_2c4 + fVar19 * local_288;
              fVar24 = fStack_254 * fStack_1dc + fVar24 * fStack_284;
              auVar30._4_4_ = local_268._4_4_;
              auVar30._0_4_ = fVar8;
              auVar30._8_4_ = local_268._8_4_;
              auVar30._12_4_ = local_268._12_4_;
              auVar31._4_12_ = auVar30._4_12_;
              auVar31._0_4_ = fVar8 * fVar8 + fVar24 * fVar24 + fVar19 * fVar19 + fVar10 * fVar10;
              auVar27._4_4_ = local_268._4_4_;
              auVar27._0_4_ = auVar31._0_4_;
              auVar27._8_4_ = local_268._8_4_;
              auVar27._12_4_ = local_268._12_4_;
              auVar16 = rsqrtss(auVar27,auVar31);
              fVar25 = auVar16._0_4_;
              fVar25 = fVar25 * fVar25 * auVar31._0_4_ * -0.5 * fVar25 + fVar25 * 1.5;
              if (0.9995 < (float)local_218._0_4_) {
                fVar10 = fVar10 * fVar25;
              }
              else {
                fVar10 = fVar9 * fVar12 - fVar14 * fVar15 * fVar7;
              }
              uVar3 = (int)((uint)(0.9995 < (float)local_218._0_4_) << 0x1f) >> 0x1f;
              uVar18 = (int)((uint)(0.9995 < (float)local_218._0_4_) << 0x1f) >> 0x1f;
              fVar9 = (float)(~uVar3 & (uint)(fVar12 * fStack_2c4 - fVar7 * fVar34 * fVar15) |
                             (uint)(fVar19 * fVar25) & uVar3);
              fVar14 = (float)(~uVar18 & (uint)(fVar12 * fStack_1dc - fVar7 * fVar36 * fVar15) |
                              (uint)(fVar24 * fVar25) & uVar18);
              if (0.9995 < (float)local_218._0_4_) {
                fVar8 = fVar8 * fVar25;
              }
              else {
                fVar8 = fVar12 * local_238 - fVar13 * fVar15 * fVar7;
              }
              local_298 = local_298 * local_258 + local_168 * local_288;
              fStack_294 = fStack_294 * fStack_254 + fStack_164 * fStack_284;
              fStack_290 = fStack_290 * fStack_250 + fStack_160 * fStack_280;
              fStack_28c = fStack_28c * fStack_24c + fStack_15c * fStack_27c;
              fVar35 = local_1e8 * local_258 + local_208 * local_288;
              fVar37 = fStack_1e4 * fStack_254 + fStack_204 * fStack_284;
              fVar38 = local_158 * local_258 + local_178 * local_288;
              fVar39 = fStack_154 * fStack_254 + fStack_174 * fStack_284;
              fVar40 = fStack_150 * fStack_250 + fStack_170 * fStack_280;
              local_2c8 = aVar2.x;
              fStack_2c0 = aVar2.z;
              fVar41 = local_2c8 * local_258 + local_1f8 * local_288;
              fVar42 = fStack_2c4 * fStack_254 + fStack_1f4 * fStack_284;
              fVar43 = fStack_2c0 * fStack_250 + fStack_1f0 * fStack_280;
              fVar24 = fVar10 * fVar14 + fVar9 * fVar8;
              fVar12 = fVar10 * fVar14 - fVar9 * fVar8;
              fVar15 = fVar9 * fVar9 - fVar10 * fVar10;
              fVar13 = fVar9 * fVar9 + fVar10 * fVar10 + -fVar14 * fVar14 + -fVar8 * fVar8;
              fVar36 = fVar14 * fVar14 + fVar15 + -fVar8 * fVar8;
              fVar32 = fVar10 * fVar8 - fVar9 * fVar14;
              fVar34 = fVar9 * fVar14 + fVar10 * fVar8;
              fVar7 = fVar14 * fVar8 + fVar9 * fVar10;
              fVar25 = fVar14 * fVar8 - fVar9 * fVar10;
              fVar9 = fVar8 * fVar8 + fVar15 + -fVar14 * fVar14;
              fVar24 = fVar24 + fVar24;
              fVar32 = fVar32 + fVar32;
              fVar12 = fVar12 + fVar12;
              fVar7 = fVar7 + fVar7;
              fVar34 = fVar34 + fVar34;
              fVar25 = fVar25 + fVar25;
              fVar14 = fVar13 * 1.0 + fVar24 * 0.0 + fVar32 * 0.0;
              fVar15 = fVar13 * 0.0 + fVar24 * 1.0 + fVar32 * 0.0;
              fVar19 = fVar13 * 0.0 + fVar24 * 0.0 + fVar32 * 1.0;
              fVar24 = fVar13 * 0.0 + fVar24 * 0.0 + fVar32 * 0.0;
              fVar8 = fVar12 * 1.0 + fVar36 * 0.0 + fVar7 * 0.0;
              fVar10 = fVar12 * 0.0 + fVar36 * 1.0 + fVar7 * 0.0;
              fVar13 = fVar12 * 0.0 + fVar36 * 0.0 + fVar7 * 1.0;
              fVar7 = fVar12 * 0.0 + fVar36 * 0.0 + fVar7 * 0.0;
              fVar12 = fVar34 * 1.0 + fVar25 * 0.0 + fVar9 * 0.0;
              fVar36 = fVar34 * 0.0 + fVar25 * 1.0 + fVar9 * 0.0;
              fVar32 = fVar34 * 0.0 + fVar25 * 0.0 + fVar9 * 1.0;
              fVar9 = fVar34 * 0.0 + fVar25 * 0.0 + fVar9 * 0.0;
              fVar25 = local_258 * local_138.m128[0] + local_288 * local_148.m128[0];
              fVar34 = fStack_254 * local_138.m128[1] + fStack_284 * local_148.m128[1];
              fVar33 = fStack_250 * local_138.m128[2] + fStack_280 * local_148.m128[2];
              local_2b8[3] = fVar33 * (fVar38 * fVar24 + fVar39 * fVar7 + fVar40 * fVar9) +
                             fVar41 * fVar24 + fVar42 * fVar7 + fVar43 * fVar9 + 0.0 +
                             fVar34 * (fVar35 * fVar24 + fVar37 * fVar7 + fVar9 * 0.0) +
                             fVar25 * (local_298 * fVar24 + fVar7 * 0.0 + fVar9 * 0.0);
              local_2b8[0] = fVar33 * (fVar38 * fVar14 + fVar39 * fVar8 + fVar40 * fVar12) +
                             fVar41 * fVar14 + fVar42 * fVar8 + fVar43 * fVar12 + fStack_294 + 0.0 +
                             fVar34 * (fVar35 * fVar14 + fVar37 * fVar8 + fVar12 * 0.0) +
                             fVar25 * (local_298 * fVar14 + fVar8 * 0.0 + fVar12 * 0.0);
              local_2b8[1] = fVar33 * (fVar38 * fVar15 + fVar39 * fVar10 + fVar40 * fVar36) +
                             fVar41 * fVar15 + fVar42 * fVar10 + fVar43 * fVar36 + fStack_290 + 0.0
                             + fVar34 * (fVar35 * fVar15 + fVar37 * fVar10 + fVar36 * 0.0) +
                             fVar25 * (local_298 * fVar15 + fVar10 * 0.0 + fVar36 * 0.0);
              local_2b8[2] = fVar33 * (fVar38 * fVar19 + fVar39 * fVar13 + fVar40 * fVar32) +
                             fVar41 * fVar19 + fVar42 * fVar13 + fVar43 * fVar32 +
                             fStack_1e0 * fStack_250 + fStack_200 * fStack_280 + 0.0 +
                             fVar34 * (fVar35 * fVar19 + fVar37 * fVar13 + fVar32 * 0.0) +
                             fVar25 * (local_298 * fVar19 + fVar13 * 0.0 + fVar32 * 0.0);
              fVar9 = local_2b8[lVar4] - local_1c8[lVar4];
              if (local_2b8[lVar4] - local_1c8[lVar4] <= fVar11) {
                fVar9 = fVar11;
              }
              fVar11 = fVar9;
              uVar5 = uVar5 + 1;
            } while (local_270 != uVar5);
            (local_1b8->upper).field_0.m128[lVar4] = fVar11;
            __return_storage_ptr__ = local_1b8;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        iVar1 = (int)local_f0;
        local_f0 = (ulong)(iVar1 + 1);
      } while (iVar1 == 0);
      iVar1 = (int)local_118;
      local_118 = (ulong)(iVar1 + 1);
    } while (iVar1 == 0);
    iVar1 = (int)local_120;
    local_120 = (ulong)(iVar1 + 1);
  } while (iVar1 == 0);
  return __return_storage_ptr__;
}

Assistant:

BBox3fa boundSegmentNonlinear(MotionDerivativeCoefficients const& motionDerivCoeffs,
                                AffineSpace3fa const& xfm0,
                                AffineSpace3fa const& xfm1,
                                BBox3fa const& obbox0,
                                BBox3fa const& obbox1,
                                BBox3fa const& bbox0,
                                BBox3fa const& bbox1,
                                float tmin,
                                float tmax)
  {
    BBox3fa delta(Vec3fa(0.f), Vec3fa(0.f));
    float roots[32];
    unsigned int maxNumRoots = 32;
    unsigned int numRoots;
    const Interval1f interval(tmin, tmax);

    // loop over bounding box corners
    for (int ii = 0; ii < 2; ++ii)
    for (int jj = 0; jj < 2; ++jj)
    for (int kk = 0; kk < 2; ++kk)
    {
      Vec3fa p0(ii == 0 ? obbox0.lower.x : obbox0.upper.x,
                jj == 0 ? obbox0.lower.y : obbox0.upper.y,
                kk == 0 ? obbox0.lower.z : obbox0.upper.z);
      Vec3fa p1(ii == 0 ? obbox1.lower.x : obbox1.upper.x,
                jj == 0 ? obbox1.lower.y : obbox1.upper.y,
                kk == 0 ? obbox1.lower.z : obbox1.upper.z);

      // get extrema of motion of bounding box corner for each dimension
      for (int dim = 0; dim < 3; ++dim)
      {
        MotionDerivative motionDerivative(motionDerivCoeffs, dim, p0, p1);

        numRoots = motionDerivative.findRoots(interval, bbox0.lower[dim] - bbox1.lower[dim], roots, maxNumRoots);
        for (unsigned int r = 0; r < numRoots; ++r) {
          float t = roots[r];
          const BBox3fa bt = lerp(bbox0, bbox1, t);
          const Vec3fa  pt = xfmPoint(slerp(xfm0, xfm1, t), lerp(p0, p1, t));
          delta.lower[dim] = std::min(delta.lower[dim], pt[dim] - bt.lower[dim]);
        }

        numRoots = motionDerivative.findRoots(interval, bbox0.upper[dim] - bbox1.upper[dim], roots, maxNumRoots);
        for (unsigned int r = 0; r < numRoots; ++r) {
          float t = roots[r];
          const BBox3fa bt = lerp(bbox0, bbox1, t);
          const Vec3fa  pt = xfmPoint(slerp(xfm0, xfm1, t), lerp(p0, p1, t));
          delta.upper[dim] = std::max(delta.upper[dim], pt[dim] - bt.upper[dim]);
        }
      }
    }

    return delta;
  }